

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyserexternalvariable.cpp
# Opt level: O2

void __thiscall
AnalyserExternalVariable_removeDependencyByIndex_Test::TestBody
          (AnalyserExternalVariable_removeDependencyByIndex_Test *this)

{
  element_type *peVar1;
  bool bVar2;
  char cVar3;
  char *pcVar4;
  allocator<char> local_a2;
  allocator<char> local_a1;
  string local_a0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  string local_90 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  AssertionResult gtest_ar;
  AnalyserExternalVariablePtr externalVariable;
  AssertionResult gtest_ar_;
  ModelPtr model;
  ParserPtr parser;
  
  libcellml::Parser::create(SUB81(&parser,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar_,"generator/hodgkin_huxley_squid_axon_model_1952/model.cellml",
             (allocator<char> *)&externalVariable);
  fileContents((string *)&gtest_ar);
  libcellml::Parser::parseModel((string *)&model);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  externalVariable.
  super___shared_ptr<libcellml::AnalyserExternalVariable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"size_t(0)","parser->issueCount()",(unsigned_long *)&gtest_ar_,
             (unsigned_long *)&externalVariable);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&externalVariable,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserexternalvariable.cpp"
               ,0x61,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&externalVariable,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&externalVariable);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bVar2 = (bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar,"membrane",&local_a1);
  libcellml::ComponentEntity::component(local_a0,bVar2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar_,"V",&local_a2);
  libcellml::Component::variable(local_90);
  libcellml::AnalyserExternalVariable::create((shared_ptr *)&externalVariable);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
  std::__cxx11::string::~string((string *)&gtest_ar);
  cVar3 = libcellml::AnalyserExternalVariable::removeDependency
                    ((ulong)externalVariable.
                            super___shared_ptr<libcellml::AnalyserExternalVariable,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr);
  gtest_ar_._0_8_ = CONCAT71(gtest_ar_._1_7_,cVar3) ^ 1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (cVar3 != '\0') {
    testing::Message::Message((Message *)local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&gtest_ar,&gtest_ar_.success_,"externalVariable->removeDependency(0)","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserexternalvariable.cpp"
               ,0x65,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a0,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a0);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_90);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  peVar1 = externalVariable.
           super___shared_ptr<libcellml::AnalyserExternalVariable,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar,"membrane",&local_a1);
  libcellml::ComponentEntity::component
            (local_a0,(bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr._0_1_);
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar_,"Cm",&local_a2);
  libcellml::Component::variable(local_90);
  libcellml::AnalyserExternalVariable::addDependency((shared_ptr *)peVar1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
  std::__cxx11::string::~string((string *)&gtest_ar);
  cVar3 = libcellml::AnalyserExternalVariable::removeDependency
                    ((ulong)externalVariable.
                            super___shared_ptr<libcellml::AnalyserExternalVariable,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = (bool)cVar3;
  if (cVar3 == '\0') {
    testing::Message::Message((Message *)local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&gtest_ar,&gtest_ar_.success_,"externalVariable->removeDependency(0)","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserexternalvariable.cpp"
               ,0x69,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a0,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a0);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_90);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  cVar3 = libcellml::AnalyserExternalVariable::removeDependency
                    ((ulong)externalVariable.
                            super___shared_ptr<libcellml::AnalyserExternalVariable,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr);
  gtest_ar_._0_8_ = CONCAT71(gtest_ar_._1_7_,cVar3) ^ 1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (cVar3 != '\0') {
    testing::Message::Message((Message *)local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&gtest_ar,&gtest_ar_.success_,"externalVariable->removeDependency(1)","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserexternalvariable.cpp"
               ,0x6a,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a0,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a0);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_90);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&externalVariable.
              super___shared_ptr<libcellml::AnalyserExternalVariable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(AnalyserExternalVariable, removeDependencyByIndex)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    auto externalVariable = libcellml::AnalyserExternalVariable::create(model->component("membrane")->variable("V"));

    EXPECT_FALSE(externalVariable->removeDependency(0));

    externalVariable->addDependency(model->component("membrane")->variable("Cm"));

    EXPECT_TRUE(externalVariable->removeDependency(0));
    EXPECT_FALSE(externalVariable->removeDependency(1));
}